

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

void strarray_remove_ext(strarray *array,char *element,_Bool resize)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = strlen(element);
  sVar3 = array->length - (sVar1 + 1);
  if (sVar3 == 0) {
    free(array->value);
    array->value = (char *)0x0;
    array->length = 0;
  }
  else {
    array->length = sVar3;
    if (element <= array->value + sVar3) {
      memmove(element,element + sVar1 + 1,(size_t)(array->value + (sVar3 - (long)element)));
    }
    if (resize) {
      pcVar2 = (char *)realloc(array->value,array->length + 0x3f & 0xffffffffffffffc0);
      if (pcVar2 != (char *)0x0) {
        array->value = pcVar2;
      }
    }
  }
  return;
}

Assistant:

void
strarray_remove_ext(struct strarray *array, char *element, bool resize) {
  char *ptr1;
  size_t len;

  /* get length of element to remove */
  len = strlen(element) + 1;
  if (len == array->length) {
    strarray_free(array);
    return;
  }

  /* adjust length */
  array->length -= len;

  /* remove element from memory */
  if (element <= array->value + array->length) {
    memmove(element, element + len, array->length - (element - array->value));
  }

  if (!resize) {
    return;
  }

  /* adjust memory block */
  ptr1 = realloc(array->value, STRARRAY_MEMSIZE(array->length));
  if (ptr1 == NULL) {
    /* just keep the current memory block */
    return;
  }

  /* adjust value pointer to new memory block */
  array->value = ptr1;
}